

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLException::loadExceptText(XMLException *this,Codes toLoad)

{
  char cVar1;
  XMLCh *pXVar2;
  undefined4 in_register_00000034;
  undefined1 *toRep;
  XMLCh errText [2048];
  XMLCh aXStack_1018 [2052];
  
  toRep = (undefined1 *)aXStack_1018;
  this->fCode = toLoad;
  cVar1 = (**(code **)(*sMsgLoader + 0x10))
                    (sMsgLoader,CONCAT44(in_register_00000034,toLoad),aXStack_1018,0x7ff);
  if (cVar1 == '\0') {
    toRep = XMLUni::fgDefErrMsg;
  }
  pXVar2 = XMLString::replicate((XMLCh *)toRep,this->fMemoryManager);
  this->fMsg = pXVar2;
  return;
}

Assistant:

void XMLException::loadExceptText(const XMLExcepts::Codes toLoad)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 2047;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}